

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecompress(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                int pitch,int height,int pixelSize,int flags)

{
  int iVar1;
  uint pixelFormat;
  
  if (((uint)flags >> 9 & 1) == 0) {
    if (pixelSize == 1) {
      pixelFormat = 6;
    }
    else if (pixelSize == 4) {
      if ((flags & 0x40U) == 0) {
        pixelFormat = flags & 1U | 2;
      }
      else {
        pixelFormat = flags & 1U ^ 5;
      }
    }
    else if (pixelSize == 3) {
      pixelFormat = flags & 1;
    }
    else {
      pixelFormat = 0xffffffff;
    }
    iVar1 = tjDecompress2(handle,jpegBuf,jpegSize,dstBuf,width,pitch,height,pixelFormat,flags);
  }
  else {
    iVar1 = tjDecompressToYUV2(handle,jpegBuf,jpegSize,dstBuf,0,4,0,flags);
  }
  return iVar1;
}

Assistant:

DLLEXPORT int tjDecompress(tjhandle handle, unsigned char *jpegBuf,
                           unsigned long jpegSize, unsigned char *dstBuf,
                           int width, int pitch, int height, int pixelSize,
                           int flags)
{
  if (flags & TJ_YUV)
    return tjDecompressToYUV(handle, jpegBuf, jpegSize, dstBuf, flags);
  else
    return tjDecompress2(handle, jpegBuf, jpegSize, dstBuf, width, pitch,
                         height, getPixelFormat(pixelSize, flags), flags);
}